

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int autotest(void)

{
  Vector *pVVar1;
  exception *e;
  undefined1 local_f0 [8];
  VectorHori v3;
  VectorHori v4;
  string local_78;
  Vector *local_58;
  Vector *v2;
  string local_48;
  Vector *local_18;
  Vector *v1;
  
  pVVar1 = (Vector *)operator_new(0x38);
  v2._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Test.txt",(allocator<char> *)((long)&v2 + 7));
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)pVVar1,&local_48,0x49);
  v2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v2 + 7));
  local_18 = pVVar1;
  pVVar1 = (Vector *)operator_new(0x38);
  v4.super_Vector.vector_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Test.txt",(allocator<char> *)((long)&v4.super_Vector.vector_ + 7))
  ;
  VECTOR_HORI_VERT::VectorHori::VectorHori((VectorHori *)pVVar1,&local_78,0x39);
  v4.super_Vector.vector_._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v4.super_Vector.vector_ + 7));
  local_58 = pVVar1;
  VECTOR_HORI_VERT::operator-((VectorHori *)&v3.super_Vector.vector_,local_18,pVVar1);
  VECTOR_HORI_VERT::operator+((VectorHori *)local_f0,local_18,local_58);
  if ((((*(int *)v3.super_Vector._40_8_ == 1) && (*(int *)(v3.super_Vector._40_8_ + 4) == 3)) &&
      (*(int *)(v3.super_Vector._40_8_ + 8) == 0)) &&
     (((v3.super_Vector.filename_.field_2._8_4_ == 3 && (*(int *)v4.super_Vector._40_8_ == 1)) &&
      ((*(int *)(v4.super_Vector._40_8_ + 4) == 6 && (v4.super_Vector.filename_.field_2._8_4_ == 2))
      )))) {
    if (local_58 != (Vector *)0x0) {
      (*local_58->_vptr_Vector[2])();
    }
    if (local_18 != (Vector *)0x0) {
      (*local_18->_vptr_Vector[2])();
    }
    v1._4_4_ = 0;
  }
  else {
    VECTOR_HORI_VERT::VectorHori::Output((VectorHori *)&v3.super_Vector.vector_);
    if (local_58 != (Vector *)0x0) {
      (*local_58->_vptr_Vector[2])();
    }
    if (local_18 != (Vector *)0x0) {
      (*local_18->_vptr_Vector[2])();
    }
    v1._4_4_ = 1;
  }
  VECTOR_HORI_VERT::VectorHori::~VectorHori((VectorHori *)local_f0);
  VECTOR_HORI_VERT::VectorHori::~VectorHori((VectorHori *)&v3.super_Vector.vector_);
  return v1._4_4_;
}

Assistant:

int autotest(){
    try
    {
    Vector* v1=new VectorHori("Test.txt",73);
    Vector* v2=new VectorHori("Test.txt",57);
    VectorHori v4=*v1-*v2;
    VectorHori v3=*v1+*v2;
    if ( (v3.vector_[0]==1) && (v3.vector_[1]==3) && (v3.vector_[2]==0) && (v3.L==3)
      && (v4.vector_[0]==1) && (v4.vector_[1]==6) && (v4.L==2) ){
        delete v2;
        delete v1;
        return 0;
    }else{
        v4.Output();
        delete v2;
        delete v1;
        return 1;
    }
    }
    catch (const std::exception& e) {
        std::cerr << e.what() << std::endl;
        return -1;
    }
}